

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2Features_Test::TestBody
          (FeaturesTest_Proto2Features_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *file_00;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  FeatureSet *this_00;
  ConstType this_01;
  FieldDescriptor *pFVar5;
  ConstType this_02;
  EnumDescriptor *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *gmock_p0;
  EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher;
  char *in_R9;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffff430;
  AssertHelper local_9c0;
  Message local_9b8;
  string local_9b0 [32];
  EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_990;
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_970;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_10;
  string file_textproto;
  FileDescriptorProto proto;
  Message local_820;
  CppStringType local_814;
  string_view local_810;
  CppStringType local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_9;
  Message local_7e0;
  CppStringType local_7d4;
  string_view local_7d0;
  CppStringType local_7bc;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_788;
  Message local_780;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_740;
  Message local_738;
  string_view local_730;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_6e8;
  Message local_6e0;
  string_view local_6d8;
  bool local_6c1;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_690;
  Message local_688;
  string_view local_680;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_638;
  Message local_630;
  string_view local_628;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_5e0;
  Message local_5d8;
  string_view local_5d0;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_588;
  Message local_580;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__2;
  Message local_4c8;
  string_view local_4c0;
  FeatureSet local_4b0;
  CppFeatures_StringType local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_7;
  Message local_440;
  Utf8CheckMode local_431;
  string_view local_430;
  Utf8CheckMode local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_6;
  Message local_400;
  Utf8CheckMode local_3f1;
  string_view local_3f0;
  Utf8CheckMode local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_;
  Message local_330;
  FeatureSet local_328;
  protobuf local_2d8 [8];
  char local_2d0 [8];
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_4;
  Message local_2b0;
  FeatureSet local_2a8;
  protobuf local_258 [8];
  char local_250 [8];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_3;
  Message local_230;
  FeatureSet local_228;
  protobuf local_1d8 [8];
  char local_1d0 [8];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0;
  EnumFeature local_1a8;
  EnumFeature local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  protobuf local_180 [8];
  char local_178 [8];
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *group;
  FieldDescriptor *field;
  Descriptor *message;
  FileDescriptor *local_140;
  FileDescriptor *file;
  string_view local_128;
  ParseTextOrDie local_118;
  undefined1 local_108 [8];
  FileDescriptorProto file_proto;
  FeaturesTest_Proto2Features_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "\n    name: \"foo.proto\"\n    message_type {\n      name: \"Foo\"\n      field { name: \"bar\" number: 1 label: LABEL_OPTIONAL type: TYPE_INT64 }\n      field {\n        name: \"group\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_GROUP\n        type_name: \".Foo\"\n      }\n      field { name: \"str\" number: 3 label: LABEL_OPTIONAL type: TYPE_STRING }\n      field { name: \"rep\" number: 4 label: LABEL_REPEATED type: TYPE_INT32 }\n      field {\n        name: \"packed\"\n        number: 5\n        label: LABEL_REPEATED\n        type: TYPE_INT64\n        options { packed: true }\n      }\n      field { name: \"utf8\" number: 6 label: LABEL_REPEATED type: TYPE_STRING }\n      field { name: \"req\" number: 7 label: LABEL_REQUIRED type: TYPE_INT32 }\n      field {\n        name: \"cord\"\n        number: 8\n        label: LABEL_OPTIONAL\n        type: TYPE_BYTES\n        options { ctype: CORD }\n      }\n      field {\n        name: \"piece\"\n        number: 9\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: STRING_PIECE }\n      }\n    }\n    enum_type {\n      name: \"Foo2\"\n      value { name: \"BAR\" number: 1 }\n    }\n  "
            );
  ParseTextOrDie::ParseTextOrDie(&local_118,local_128);
  ParseTextOrDie::operator_cast_to_FileDescriptorProto((FileDescriptorProto *)local_108,&local_118);
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  pDVar2 = pb::CppFeatures::GetDescriptor();
  file_00 = Descriptor::file(pDVar2);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,file_00);
  message = (Descriptor *)
            DescriptorPool::BuildFile
                      (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,
                       (FileDescriptorProto *)local_108);
  local_140 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                        ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                         ,0x203c,"pool_.BuildFile(file_proto)",(FileDescriptor **)&message);
  pDVar2 = FileDescriptor::message_type(local_140,0);
  pFVar3 = Descriptor::field(pDVar2,0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Descriptor::field(pDVar2,1);
  EqualsProto<char_const*>(local_180,anon_var_dwarf_37cdd0 + 5);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffff430._M_head_impl);
  FileDescriptor::options(local_140);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_170,local_178,(FileOptions *)0x1d0efe5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2040,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  this_00 = GetFeatures<google::protobuf::FileDescriptor>(local_140);
  this_01 = FeatureSet::
            GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                      (this_00,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
  local_1a4 = pb::TestFeatures::file_feature(this_01);
  local_1a8 = VALUE1;
  testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
            ((EqHelper *)local_1a0,"GetFeatures(file).GetExtension(pb::test).file_feature()",
             "pb::VALUE1",&local_1a4,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2042,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  EqualsProto<char_const*>
            (local_1d8,
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffff430._M_head_impl);
  GetCoreFeatures<google::protobuf::FileDescriptor>(&local_228,local_140);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_1c8,local_1d0,(FeatureSet *)"GetCoreFeatures(file)");
  FeatureSet::~FeatureSet(&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2050,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  EqualsProto<char_const*>
            (local_258,
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffff430._M_head_impl);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_2a8,pFVar3);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_248,local_250,(FeatureSet *)"GetCoreFeatures(field)");
  FeatureSet::~FeatureSet(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x205e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  EqualsProto<char_const*>
            (local_2d8,
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: DELIMITED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffff430._M_head_impl);
  GetCoreFeatures<google::protobuf::FieldDescriptor>
            (&local_328,
             (FieldDescriptor *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_2c8,local_2d0,(FeatureSet *)"GetCoreFeatures(group)");
  FeatureSet::~FeatureSet(&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_349 = FieldDescriptor::has_presence(pFVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_348,(AssertionResult *)0x20d814f,
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar3);
  local_391 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_390,(AssertionResult *)0x1d15291,
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f0,"str");
  pFVar5 = Descriptor::FindFieldByName(pDVar2,local_3f0);
  local_3d9 = internal::cpp::GetUtf8CheckMode(pFVar5,false);
  local_3f1 = kVerify;
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::cpp::Utf8CheckMode,_google::protobuf::internal::cpp::Utf8CheckMode,_nullptr>
            ((EqHelper *)local_3d8,"GetUtf8CheckMode(message->FindFieldByName(\"str\"), false)",
             "Utf8CheckMode::kVerify",&local_3d9,&local_3f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2071,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_430,"str");
  pFVar5 = Descriptor::FindFieldByName(pDVar2,local_430);
  local_419 = internal::cpp::GetUtf8CheckMode(pFVar5,true);
  local_431 = kNone;
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::cpp::Utf8CheckMode,_google::protobuf::internal::cpp::Utf8CheckMode,_nullptr>
            ((EqHelper *)local_418,"GetUtf8CheckMode(message->FindFieldByName(\"str\"), true)",
             "Utf8CheckMode::kNone",&local_419,&local_431);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2073,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c0,"cord");
  pFVar5 = Descriptor::FindFieldByName(pDVar2,local_4c0);
  GetCoreFeatures<google::protobuf::FieldDescriptor>(&local_4b0,pFVar5);
  this_02 = FeatureSet::
            GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                      (&local_4b0,
                       (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                        *)pb::cpp);
  local_45c = pb::CppFeatures::string_type(this_02);
  testing::internal::EqHelper::
  Compare<pb::CppFeatures_StringType,_pb::CppFeatures_StringType,_nullptr>
            ((EqHelper *)local_458,
             "GetCoreFeatures(message->FindFieldByName(\"cord\")) .GetExtension(pb::cpp) .string_type()"
             ,"pb::CppFeatures::CORD",&local_45c,&pb::CppFeatures::CORD);
  FeatureSet::~FeatureSet(&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2077,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  bVar1 = FieldDescriptor::is_packed(pFVar3);
  local_4e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_4e0,(AssertionResult *)0x1d153c4,
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2078,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  bVar1 = FieldDescriptor::legacy_enum_field_treated_as_closed(pFVar3);
  local_529 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_528,
               (AssertionResult *)"field->legacy_enum_field_treated_as_closed()","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2079,pcVar4);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  bVar1 = internal::cpp::HasPreservingUnknownEnumSemantics(pFVar3);
  local_571 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_570,&local_571,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_570,
               (AssertionResult *)"HasPreservingUnknownEnumSemantics(field)","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5d0,"str");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_5d0);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar3);
  local_5b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_5b8,
               (AssertionResult *)"message->FindFieldByName(\"str\")->requires_utf8_validation()",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_628,"rep");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_628);
  bVar1 = FieldDescriptor::is_packed(pFVar3);
  local_611 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_610,
               (AssertionResult *)"message->FindFieldByName(\"rep\")->is_packed()","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_680,"utf8");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_680);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar3);
  local_669 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_668,&local_669,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_668,
               (AssertionResult *)"message->FindFieldByName(\"utf8\")->requires_utf8_validation()",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6d8,"packed");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_6d8);
  local_6c1 = FieldDescriptor::is_packed(pFVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6c0,&local_6c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_6c0,
               (AssertionResult *)"message->FindFieldByName(\"packed\")->is_packed()","false","true"
               ,in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_730,"req");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_730);
  local_719 = FieldDescriptor::is_required(pFVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_718,
               (AssertionResult *)"message->FindFieldByName(\"req\")->is_required()","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_740,&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  this_03 = FileDescriptor::enum_type(local_140,0);
  local_771 = EnumDescriptor::is_closed(this_03);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_770,&local_771,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_770,
               (AssertionResult *)"file->enum_type(0)->is_closed()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2080,pcVar4);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d0,"str");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_7d0);
  local_7bc = FieldDescriptor::cpp_string_type(pFVar3);
  local_7d4 = kString;
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::CppStringType,_google::protobuf::internal::FieldDescriptorLite::CppStringType,_nullptr>
            ((EqHelper *)local_7b8,"message->FindFieldByName(\"str\")->cpp_string_type()",
             "FieldDescriptor::CppStringType::kString",&local_7bc,&local_7d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2083,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_810,"cord");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_810);
  local_7fc = FieldDescriptor::cpp_string_type(pFVar3);
  local_814 = kCord;
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::CppStringType,_google::protobuf::internal::FieldDescriptorLite::CppStringType,_nullptr>
            ((EqHelper *)local_7f8,"message->FindFieldByName(\"cord\")->cpp_string_type()",
             "FieldDescriptor::CppStringType::kCord",&local_7fc,&local_814);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&proto.field_0 + 0xe0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2085,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&proto.field_0 + 0xe0),&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&proto.field_0 + 0xe0));
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)((long)&file_textproto.field_2 + 8));
  FileDescriptor::CopyTo(local_140,(FileDescriptorProto *)((long)&file_textproto.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar_10.message_);
  TextFormat::PrintToString((Message *)local_108,(string *)&gtest_ar_10.message_);
  std::__cxx11::string::string(local_9b0,(string *)&gtest_ar_10.message_);
  EqualsProto<std::__cxx11::string>(&local_990,(protobuf *)local_9b0,gmock_p0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::string>>
            (&local_970,(internal *)&local_990,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::string>>::
  operator()(local_950,(char *)&local_970,(FileDescriptorProto *)0x2086c00);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_970);
  EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~EqualsProtoMatcherP(&local_990);
  std::__cxx11::string::~string(local_9b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_9b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x208c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
  FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)((long)&file_textproto.field_2 + 8));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(FeaturesTest, Proto2Features) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    message_type {
      name: "Foo"
      field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT64 }
      field {
        name: "group"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_GROUP
        type_name: ".Foo"
      }
      field { name: "str" number: 3 label: LABEL_OPTIONAL type: TYPE_STRING }
      field { name: "rep" number: 4 label: LABEL_REPEATED type: TYPE_INT32 }
      field {
        name: "packed"
        number: 5
        label: LABEL_REPEATED
        type: TYPE_INT64
        options { packed: true }
      }
      field { name: "utf8" number: 6 label: LABEL_REPEATED type: TYPE_STRING }
      field { name: "req" number: 7 label: LABEL_REQUIRED type: TYPE_INT32 }
      field {
        name: "cord"
        number: 8
        label: LABEL_OPTIONAL
        type: TYPE_BYTES
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 9
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
    }
    enum_type {
      name: "Foo2"
      value { name: "BAR" number: 1 }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);
  const FieldDescriptor* field = message->field(0);
  const FieldDescriptor* group = message->field(1);
  EXPECT_THAT(file->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(file).GetExtension(pb::test).file_feature(),
            pb::VALUE1);
  EXPECT_THAT(GetCoreFeatures(file), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(field), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(group), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: DELIMITED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_TRUE(field->has_presence());
  EXPECT_FALSE(field->requires_utf8_validation());
  EXPECT_EQ(
      GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/false),
      Utf8CheckMode::kVerify);
  EXPECT_EQ(GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/true),
            Utf8CheckMode::kNone);
  EXPECT_EQ(GetCoreFeatures(message->FindFieldByName("cord"))
                .GetExtension(pb::cpp)
                .string_type(),
            pb::CppFeatures::CORD);
  EXPECT_FALSE(field->is_packed());
  EXPECT_FALSE(field->legacy_enum_field_treated_as_closed());
  EXPECT_FALSE(HasPreservingUnknownEnumSemantics(field));
  EXPECT_FALSE(message->FindFieldByName("str")->requires_utf8_validation());
  EXPECT_FALSE(message->FindFieldByName("rep")->is_packed());
  EXPECT_FALSE(message->FindFieldByName("utf8")->requires_utf8_validation());
  EXPECT_TRUE(message->FindFieldByName("packed")->is_packed());
  EXPECT_TRUE(message->FindFieldByName("req")->is_required());
  EXPECT_TRUE(file->enum_type(0)->is_closed());

  EXPECT_EQ(message->FindFieldByName("str")->cpp_string_type(),
            FieldDescriptor::CppStringType::kString);
  EXPECT_EQ(message->FindFieldByName("cord")->cpp_string_type(),
            FieldDescriptor::CppStringType::kCord);

  // Check round-trip consistency.
  FileDescriptorProto proto;
  file->CopyTo(&proto);
  std::string file_textproto;
  google::protobuf::TextFormat::PrintToString(file_proto, &file_textproto);
  EXPECT_THAT(proto, EqualsProto(file_textproto));
}